

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_literal.h
# Opt level: O3

bool __thiscall
viras::
LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
::lim(LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      *this,Infty i)

{
  RationalConstantType *o;
  RationalConstantType *pRVar1;
  InnerType *pIVar2;
  PredSymbol PVar3;
  bool bVar4;
  InnerType *o_00;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  local_70;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  local_48;
  
  PVar3 = this->symbol;
  if (PVar3 < Neq) {
    local_70.
    super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
    .config = (this->term).oslp.
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
              .config;
    o = &(this->term).oslp.
         super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
         .inner;
    o_00 = &(this->term).oslp.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
            .inner._den;
    if ((i.positive & 1U) == 0) {
      pRVar1 = &local_70.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .inner;
      Kernel::IntegerConstantType::IntegerConstantType(&pRVar1->_num,&o->_num);
      pIVar2 = &local_70.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .inner._den;
      Kernel::IntegerConstantType::IntegerConstantType(pIVar2,o_00);
      bVar4 = sugar::operator<(&local_70,0);
      mpz_clear(pIVar2->_val);
      mpz_clear((__mpz_struct *)pRVar1);
    }
    else {
      pRVar1 = &local_48.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .inner;
      local_48.
      super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
      .config = local_70.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .config;
      Kernel::IntegerConstantType::IntegerConstantType(&pRVar1->_num,&o->_num);
      pIVar2 = &local_48.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .inner._den;
      Kernel::IntegerConstantType::IntegerConstantType(pIVar2,o_00);
      bVar4 = sugar::operator>(&local_48,0);
      mpz_clear(pIVar2->_val);
      mpz_clear((__mpz_struct *)pRVar1);
    }
  }
  else if (PVar3 == Neq) {
    bVar4 = true;
  }
  else {
    if (PVar3 != Eq) {
      do {
      } while( true );
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool lim(Infty i) const
    { 
      VIRAS_ASSERT(term.oslp != 0);
      switch (symbol) {
      case PredSymbol::Gt:
      case PredSymbol::Geq: return i.positive ? term.oslp > 0 
                                              : term.oslp < 0;
      case PredSymbol::Neq: return true;
      case PredSymbol::Eq: return false;
      }
      VIRAS_UNREACHABLE
    }